

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::readFromBinary(Binasc *this,string *outfile,istream *input)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ofstream output;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220);
  std::ofstream::open((char *)&local_220,(_Ios_Openmode)(outfile->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot open ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(outfile->_M_dataplus)._M_p,outfile->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," for reading in binasc.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    iVar2 = 0;
    std::ostream::flush();
  }
  else {
    iVar2 = readFromBinary(this,(ostream *)&local_220,input);
    std::ofstream::close();
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return iVar2;
}

Assistant:

int Binasc::readFromBinary(const std::string& outfile, std::istream& input) {
	std::ofstream output;
	output.open(outfile.c_str());
	if (!output.is_open()) {
		std::cerr << "Cannot open " << outfile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = readFromBinary(output, input);
	output.close();
	return status;
}